

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extGetUnicodeSetString
               (UConverterSharedData *sharedData,int32_t *cx,USetAdder *sa,
               UConverterUnicodeSet which,int32_t minLength,UChar32 firstCP,UChar *s,int32_t length,
               int32_t sectionIndex,UErrorCode *pErrorCode)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint value;
  UBool UVar4;
  UConverterUnicodeSet which_00;
  undefined4 in_register_0000008c;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int32_t in_stack_ffffffffffffffa8;
  
  lVar5 = CONCAT44(in_register_0000008c,firstCP);
  lVar7 = (long)length;
  iVar2 = *(int *)((long)&sharedData->staticData + 4);
  iVar3._0_1_ = sharedData->sharedDataCached;
  iVar3._1_1_ = sharedData->isReferenceCounted;
  iVar3._2_2_ = *(undefined2 *)&sharedData->field_0x1a;
  uVar1 = *(ushort *)((long)(sharedData->mbcs).sbcsIndex + lVar7 * 2 + (long)iVar2 + -0x68);
  which_00 = (UConverterUnicodeSet)sa;
  UVar4 = extSetUseMapping(which_00,which,
                           *(uint32_t *)
                            ((long)(sharedData->mbcs).sbcsIndex + lVar7 * 4 + (long)iVar3 + -0x68));
  if (UVar4 != '\0') {
    if (2 - (uint)((uint)minLength < 0x10000) == (int)s) {
      (**(code **)(cx + 2))();
    }
    else {
      (**(code **)(cx + 6))(*(undefined8 *)cx,lVar5);
    }
  }
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined2 *)(lVar5 + (long)(int)s * 2) =
         *(undefined2 *)
          ((long)(sharedData->mbcs).sbcsIndex + uVar6 * 2 + lVar7 * 2 + (long)iVar2 + -0x66);
    value = *(uint *)((long)(sharedData->mbcs).sbcsIndex +
                     uVar6 * 4 + lVar7 * 4 + (long)iVar3 + -100);
    if (value != 0) {
      if (value < 0x1000000) {
        ucnv_extGetUnicodeSetString
                  (sharedData,cx,(USetAdder *)(ulong)which_00,which,minLength,firstCP,
                   (UChar *)(ulong)((int)s + 1),value,in_stack_ffffffffffffffa8,
                   (UErrorCode *)CONCAT44(which,which_00));
      }
      else {
        UVar4 = extSetUseMapping(which_00,which,value);
        if (UVar4 != '\0') {
          (**(code **)(cx + 6))(*(undefined8 *)cx,lVar5,(UChar *)(ulong)((int)s + 1));
        }
      }
    }
  }
  return;
}

Assistant:

static void
ucnv_extGetUnicodeSetString(const UConverterSharedData *sharedData,
                            const int32_t *cx,
                            const USetAdder *sa,
                            UConverterUnicodeSet which,
                            int32_t minLength,
                            UChar32 firstCP,
                            UChar s[UCNV_EXT_MAX_UCHARS], int32_t length,
                            int32_t sectionIndex,
                            UErrorCode *pErrorCode) {
    const UChar *fromUSectionUChars;
    const uint32_t *fromUSectionValues;

    uint32_t value;
    int32_t i, count;

    fromUSectionUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar)+sectionIndex;
    fromUSectionValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t)+sectionIndex;

    /* read first pair of the section */
    count=*fromUSectionUChars++;
    value=*fromUSectionValues++;

    if(extSetUseMapping(which, minLength, value)) {
        if(length==U16_LENGTH(firstCP)) {
            /* add the initial code point */
            sa->add(sa->set, firstCP);
        } else {
            /* add the string so far */
            sa->addString(sa->set, s, length);
        }
    }

    for(i=0; i<count; ++i) {
        /* append this code unit and recurse or add the string */
        s[length]=fromUSectionUChars[i];
        value=fromUSectionValues[i];

        if(value==0) {
            /* no mapping, do nothing */
        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
            ucnv_extGetUnicodeSetString(
                sharedData, cx, sa, which, minLength,
                firstCP, s, length+1,
                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                pErrorCode);
        } else if(extSetUseMapping(which, minLength, value)) {
            sa->addString(sa->set, s, length+1);
        }
    }
}